

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
          *cols,size_t row)

{
  bool bVar1;
  pointer pSVar2;
  const_reference pvVar3;
  ulong uVar4;
  ostream *poVar5;
  size_type in_RCX;
  string *in_RSI;
  long in_RDI;
  string value;
  const_iterator it;
  ostream *in_stack_ffffffffffffff58;
  Code _colourCode;
  ostream *in_stack_ffffffffffffff60;
  Colour local_5f;
  Colour local_5e;
  Colour local_5d [13];
  string local_50 [32];
  SummaryColumn *local_30;
  __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
  local_28;
  size_type local_20;
  string *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_28._M_current =
       (SummaryColumn *)
       std::
       vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
       ::begin((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)in_stack_ffffffffffffff58);
  while( true ) {
    local_30 = (SummaryColumn *)
               std::
               vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
               ::end((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                      *)in_stack_ffffffffffffff58);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
             ::operator->(&local_28);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&pSVar2->rows,local_20);
    std::__cxx11::string::string(local_50,(string *)pvVar3);
    __gnu_cxx::
    __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
    ::operator->(&local_28);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      if (bVar1) {
        poVar5 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff60,
                       (Code)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        _colourCode = (Code)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        poVar5 = Catch::operator<<(poVar5,&local_5e);
        std::operator<<(poVar5," | ");
        Colour::~Colour((Colour *)0x1c6ee7);
        poVar5 = *(ostream **)(in_RDI + 0x18);
        __gnu_cxx::
        __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
        ::operator->(&local_28);
        Colour::Colour((Colour *)in_stack_ffffffffffffff60,_colourCode);
        poVar5 = Catch::operator<<(poVar5,&local_5f);
        in_stack_ffffffffffffff60 = std::operator<<(poVar5,local_50);
        in_stack_ffffffffffffff58 = std::operator<<(in_stack_ffffffffffffff60," ");
        pSVar2 = __gnu_cxx::
                 __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
                 ::operator->(&local_28);
        std::operator<<(in_stack_ffffffffffffff58,(string *)pSVar2);
        Colour::~Colour((Colour *)0x1c6f70);
      }
    }
    else {
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 0x18),local_10);
      std::operator<<(poVar5,": ");
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      if (bVar1) {
        std::operator<<(*(ostream **)(in_RDI + 0x18),local_50);
      }
      else {
        poVar5 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff60,
                       (Code)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        poVar5 = Catch::operator<<(poVar5,local_5d);
        std::operator<<(poVar5,"- none -");
        Colour::~Colour((Colour *)0x1c6e56);
      }
    }
    std::__cxx11::string::~string(local_50);
    __gnu_cxx::
    __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
    ::operator++(&local_28);
  }
  std::operator<<(*(ostream **)(in_RDI + 0x18),"\n");
  return;
}

Assistant:

void printSummaryRow( std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row ) {
            for( std::vector<SummaryColumn>::const_iterator it = cols.begin(); it != cols.end(); ++it ) {
                std::string value = it->rows[row];
                if( it->label.empty() ) {
                    stream << label << ": ";
                    if( value != "0" )
                        stream << value;
                    else
                        stream << Colour( Colour::Warning ) << "- none -";
                }
                else if( value != "0" ) {
                    stream  << Colour( Colour::LightGrey ) << " | ";
                    stream  << Colour( it->colour )
                            << value << " " << it->label;
                }
            }
            stream << "\n";
        }